

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

bool __thiscall SocketInternals::SetMulticastIP(SocketInternals *this,string *multicast)

{
  uint32_t uVar1;
  
  uVar1 = EthUdpPort::IP_ULong(multicast);
  if ((uVar1 & 0xf0) == 0xe0) {
    (this->ServerAddrBroadcast).sin_addr.s_addr = uVar1;
  }
  return (uVar1 & 0xf0) == 0xe0;
}

Assistant:

bool SocketInternals::SetMulticastIP(const std::string &multicast)
{
    unsigned long s_addr_new = EthUdpPort::IP_ULong(multicast);
    unsigned long first_byte = s_addr_new & 0x000000ff;
    if ((first_byte >= 224) && (first_byte <= 239)) {
        ServerAddrBroadcast.sin_addr.s_addr = s_addr_new;
        return true;
    }
    return false;
}